

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O2

void __thiscall
JsrtDebugManager::DispatchHalt(JsrtDebugManager *this,InterpreterHaltState *haltState)

{
  code *pcVar1;
  uint lineNumber;
  bool bVar2;
  undefined4 *puVar3;
  char *message;
  char *pcVar4;
  
  pcVar4 = (char *)this;
  switch(haltState->stopType) {
  case STOP_STEPCOMPLETE:
    this->resumeAction = BREAKRESUMEACTION_CONTINUE;
  case STOP_BREAKPOINT:
  case STOP_INLINEBREAKPOINT:
  case STOP_ASYNCBREAK:
    ReportBreak(this,haltState);
    goto LAB_003950a4;
  case STOP_EXCEPTIONTHROW:
    ReportExceptionBreak(this,haltState);
    goto LAB_003950a4;
  case STOP_MUTATIONBREAKPOINT:
  case STOP_DOMMUTATIONBREAKPOINT:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    message = "Not yet handled";
    lineNumber = 0x70;
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    message = "Unhandled stop type";
    lineNumber = 0x73;
  }
  pcVar4 = 
  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
  ;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                     ,lineNumber,"(false)",message);
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_003950a4:
  HandleResume((JsrtDebugManager *)pcVar4,haltState,this->resumeAction);
  return;
}

Assistant:

void JsrtDebugManager::DispatchHalt(Js::InterpreterHaltState* haltState)
{
    switch (haltState->stopType)
    {
    case Js::STOP_BREAKPOINT: /*JsDiagDebugEventBreakpoint*/
    case Js::STOP_INLINEBREAKPOINT: /*JsDiagDebugEventDebuggerStatement*/
    case Js::STOP_ASYNCBREAK: /*JsDiagDebugEventAsyncBreak*/
        this->ReportBreak(haltState);
        break;
    case Js::STOP_STEPCOMPLETE: /*JsDiagDebugEventStepComplete*/
        this->SetResumeType(BREAKRESUMEACTION_CONTINUE);
        this->ReportBreak(haltState);
        break;
    case Js::STOP_EXCEPTIONTHROW: /*JsDiagDebugEventRuntimeException*/
        this->ReportExceptionBreak(haltState);
        break;
    case Js::STOP_DOMMUTATIONBREAKPOINT:
    case Js::STOP_MUTATIONBREAKPOINT:
        AssertMsg(false, "Not yet handled");
        break;
    default:
        AssertMsg(false, "Unhandled stop type");
    }

    this->HandleResume(haltState, this->resumeAction);
}